

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcursor.cpp
# Opt level: O3

void QCursor::setPos(QScreen *screen,int x,int y)

{
  int iVar1;
  QPlatformScreen *pQVar2;
  undefined4 extraout_var;
  QScreen *context;
  QPoint QVar4;
  QPoint QVar5;
  long in_FS_OFFSET;
  QPoint local_40;
  QPoint local_38;
  long local_30;
  long *plVar3;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (screen != (QScreen *)0x0) {
    pQVar2 = QScreen::handle(screen);
    iVar1 = (*pQVar2->_vptr_QPlatformScreen[0x16])(pQVar2);
    plVar3 = (long *)CONCAT44(extraout_var,iVar1);
    if (plVar3 != (long *)0x0) {
      QVar4.yp.m_i = y;
      QVar4.xp.m_i = x;
      local_38.xp.m_i = x;
      local_38.yp.m_i = y;
      context = QScreen::virtualSiblingAt(screen,QVar4);
      QVar4 = QHighDpi::toNativePixels<QPoint,QScreen>(&local_38,context);
      local_40 = QVar4;
      QVar5 = (QPoint)(**(code **)(*plVar3 + 0x80))(plVar3);
      if (QVar4 != QVar5) {
        (**(code **)(*plVar3 + 0x88))(plVar3,&local_40);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCursor::setPos(QScreen *screen, int x, int y)
{
    if (screen) {
        if (QPlatformCursor *cursor = screen->handle()->cursor()) {
            const QPoint pos(x, y);
            const QPoint devicePos = QHighDpi::toNativePixels(pos, screen->virtualSiblingAt(pos));
            // Need to check, since some X servers generate null mouse move
            // events, causing looping in applications which call setPos() on
            // every mouse move event.
            if (devicePos != cursor->pos())
                cursor->setPos(devicePos);
        }
    }
}